

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O1

llava_image_embed *
llava_image_embed_make_with_bytes
          (clip_ctx *ctx_clip,int n_threads,uchar *image_bytes,int image_bytes_length)

{
  bool bVar1;
  clip_image_u8 *img;
  llava_image_embed *plVar2;
  int n_image_pos;
  float *image_embed;
  int local_34;
  float *local_30;
  
  img = clip_image_u8_init();
  bVar1 = clip_image_load_from_bytes(image_bytes,(long)image_bytes_length,img);
  if (bVar1) {
    local_30 = (float *)0x0;
    local_34 = 0;
    bVar1 = llava_image_embed_make_with_clip_img(ctx_clip,n_threads,img,&local_30,&local_34);
    clip_image_u8_free(img);
    if (bVar1) {
      plVar2 = (llava_image_embed *)malloc(0x10);
      plVar2->embed = local_30;
      plVar2->n_image_pos = local_34;
      return plVar2;
    }
    llava_image_embed_make_with_bytes_cold_2();
  }
  else {
    llava_image_embed_make_with_bytes_cold_1();
  }
  return (llava_image_embed *)0x0;
}

Assistant:

struct llava_image_embed * llava_image_embed_make_with_bytes(struct clip_ctx * ctx_clip, int n_threads, const unsigned char * image_bytes, int image_bytes_length) {
    clip_image_u8 * img = clip_image_u8_init();
    if (!clip_image_load_from_bytes(image_bytes, image_bytes_length, img)) {
        clip_image_u8_free(img);
        LOG_ERR("%s: can't load image from bytes, is it a valid image?", __func__);
        return NULL;
    }

    float* image_embed = NULL;
    int n_image_pos = 0;
    bool image_embed_result = llava_image_embed_make_with_clip_img(ctx_clip, n_threads, img, &image_embed, &n_image_pos);
    if (!image_embed_result) {
        clip_image_u8_free(img);
        LOG_ERR("%s: couldn't embed the image\n", __func__);
        return NULL;
    }

    clip_image_u8_free(img);
    auto result = (llava_image_embed*)malloc(sizeof(llava_image_embed));
    result->embed = image_embed;
    result->n_image_pos = n_image_pos;
    return result;
}